

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LWOLoader.cpp
# Opt level: O2

void __thiscall
Assimp::LWOImporter::CountVertsAndFacesLWO2
          (LWOImporter *this,uint *verts,uint *faces,uint16_t **cursor,uint16_t *end,uint max)

{
  ushort *puVar1;
  ushort uVar2;
  bool bVar3;
  
  while ((puVar1 = *cursor, puVar1 < end && (bVar3 = max != 0, max = max - 1, bVar3))) {
    *cursor = puVar1 + 1;
    uVar2 = (*puVar1 & 0xff03) << 8 | *puVar1 >> 8;
    *verts = *verts + (uint)uVar2;
    *faces = *faces + 1;
    while (bVar3 = uVar2 != 0, uVar2 = uVar2 - 1, bVar3) {
      ReadVSizedIntLWO2(this,(uint8_t **)cursor);
    }
  }
  return;
}

Assistant:

void LWOImporter::CountVertsAndFacesLWO2(unsigned int& verts, unsigned int& faces,
    uint16_t*& cursor, const uint16_t* const end, unsigned int max)
{
    while (cursor < end && max--)
    {
        uint16_t numIndices;
        ::memcpy(&numIndices, cursor++, 2);
        AI_LSWAP2(numIndices);
        numIndices &= 0x03FF;

        verts += numIndices;
        ++faces;

        for(uint16_t i = 0; i < numIndices; i++)
        {
            ReadVSizedIntLWO2((uint8_t*&)cursor);
        }
    }
}